

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O2

int nc_match(GENERAL_NAME *gen,NAME_CONSTRAINTS *nc)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  undefined8 *puVar4;
  int iVar5;
  ulong uVar6;
  
  iVar5 = 0;
  uVar6 = 0;
  do {
    sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)nc->permittedSubtrees);
    if (sVar3 <= uVar6) {
      if (iVar5 == 1) {
        iVar5 = 0x2f;
      }
      else {
        iVar5 = 0;
        for (uVar6 = 0; sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)nc->excludedSubtrees), uVar6 < sVar3
            ; uVar6 = uVar6 + 1) {
          puVar4 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)nc->excludedSubtrees,uVar6);
          if (gen->type == ((GENERAL_NAME *)*puVar4)->type) {
            if ((puVar4[1] != 0) || (puVar4[2] != 0)) {
              return 0x31;
            }
            iVar2 = nc_match_single(gen,(GENERAL_NAME *)*puVar4);
            if (iVar2 != 0x2f) {
              if (iVar2 == 0) {
                return 0x30;
              }
              return iVar2;
            }
          }
        }
      }
      return iVar5;
    }
    puVar4 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)nc->permittedSubtrees,uVar6);
    iVar2 = iVar5;
    if (gen->type == ((GENERAL_NAME *)*puVar4)->type) {
      if (puVar4[1] != 0) {
        return 0x31;
      }
      if (puVar4[2] != 0) {
        return 0x31;
      }
      iVar2 = 2;
      if (((iVar5 != 2) && (iVar1 = nc_match_single(gen,(GENERAL_NAME *)*puVar4), iVar1 != 0)) &&
         (iVar2 = iVar5 + (uint)(iVar5 == 0), iVar1 != 0x2f)) {
        return iVar1;
      }
    }
    iVar5 = iVar2;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

static int nc_match(GENERAL_NAME *gen, NAME_CONSTRAINTS *nc) {
  GENERAL_SUBTREE *sub;
  int r, match = 0;
  size_t i;

  // Permitted subtrees: if any subtrees exist of matching the type at
  // least one subtree must match.

  for (i = 0; i < sk_GENERAL_SUBTREE_num(nc->permittedSubtrees); i++) {
    sub = sk_GENERAL_SUBTREE_value(nc->permittedSubtrees, i);
    if (gen->type != sub->base->type) {
      continue;
    }
    if (sub->minimum || sub->maximum) {
      return X509_V_ERR_SUBTREE_MINMAX;
    }
    // If we already have a match don't bother trying any more
    if (match == 2) {
      continue;
    }
    if (match == 0) {
      match = 1;
    }
    r = nc_match_single(gen, sub->base);
    if (r == X509_V_OK) {
      match = 2;
    } else if (r != X509_V_ERR_PERMITTED_VIOLATION) {
      return r;
    }
  }

  if (match == 1) {
    return X509_V_ERR_PERMITTED_VIOLATION;
  }

  // Excluded subtrees: must not match any of these

  for (i = 0; i < sk_GENERAL_SUBTREE_num(nc->excludedSubtrees); i++) {
    sub = sk_GENERAL_SUBTREE_value(nc->excludedSubtrees, i);
    if (gen->type != sub->base->type) {
      continue;
    }
    if (sub->minimum || sub->maximum) {
      return X509_V_ERR_SUBTREE_MINMAX;
    }

    r = nc_match_single(gen, sub->base);
    if (r == X509_V_OK) {
      return X509_V_ERR_EXCLUDED_VIOLATION;
    } else if (r != X509_V_ERR_PERMITTED_VIOLATION) {
      return r;
    }
  }

  return X509_V_OK;
}